

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  BigAttr *pBVar3;
  char *pcVar4;
  char **ppcVar5;
  FILE *__stream;
  size_t *fsize;
  char *__format;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t asStack_398 [9];
  undefined8 uStack_350;
  undefined1 auStack_348 [16];
  BigArray array;
  BigBlockPtr ptrnew;
  BigBlock bbnew;
  BigBlock bb;
  ulong local_60;
  size_t nattr;
  size_t buffersize;
  BigFile bf;
  BigFile bfnew;
  
  fsize = (size_t *)auStack_348;
  buffersize = 0;
  bf.basename = (char *)0x0;
  bbnew.dirty = 0;
  bbnew._76_4_ = 0;
  bbnew.Nfile = 0;
  bbnew._60_4_ = 0;
  bbnew.attrset = (BigAttrSet *)0x0;
  bbnew.foffset = (size_t *)0x0;
  bbnew.fchecksum = (uint *)0x0;
  bbnew.size = 0;
  bbnew.fsize = (size_t *)0x0;
  bbnew.nmemb = 0;
  bbnew._12_4_ = 0;
  bbnew.basename = (char *)0x0;
  ptrnew.aoffset = 0;
  bbnew.dtype[0] = '\0';
  bbnew.dtype[1] = '\0';
  bbnew.dtype[2] = '\0';
  bbnew.dtype[3] = '\0';
  bbnew.dtype[4] = '\0';
  bbnew.dtype[5] = '\0';
  bbnew.dtype[6] = '\0';
  bbnew.dtype[7] = '\0';
  nattr = 0x10000000;
  bfnew.basename = (char *)0x0;
  while( true ) {
    while( true ) {
      uStack_350 = 0x102499;
      iVar2 = getopt(argc,argv,"n:vB:f:");
      if (iVar2 != 0x42) break;
      uStack_350 = 0x1024b0;
      __isoc99_sscanf(_optarg,"%td",&nattr);
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x76) {
      if (iVar2 == 0x6e) {
        uStack_350 = 0x1024e5;
        atoi(_optarg);
      }
      else {
        if (iVar2 != 0x66) goto LAB_001027ca;
        bfnew.basename = _optarg;
      }
    }
  }
  lVar7 = (long)_optind;
  if (argc - _optind == 3) {
    uStack_350 = 0x10250e;
    iVar2 = big_file_open((BigFile *)&buffersize,argv[lVar7]);
    if (iVar2 == 0) {
      if (bfnew.basename == (char *)0x0) {
        bfnew.basename = argv[lVar7];
      }
      uStack_350 = 0x10252c;
      iVar2 = big_file_create(&bf,bfnew.basename);
      if (iVar2 == 0) {
        uStack_350 = 0x102549;
        iVar2 = big_file_open_block((BigFile *)&buffersize,(BigBlock *)&bbnew.dirty,argv[lVar7 + 1])
        ;
        if (iVar2 == 0) {
          fsize = asStack_398;
          for (lVar6 = 0; lVar6 != 0; lVar6 = lVar6 + 1) {
            fsize[lVar6] = 0;
          }
          iVar2 = big_file_create_block
                            (&bf,(BigBlock *)&ptrnew.aoffset,argv[lVar7 + 2],(char *)&bbnew.dirty,0,
                             0,fsize);
          __stream = _stderr;
          if (iVar2 == 0) {
            if (bbnew.basename != (char *)0x0) {
              abort();
            }
            pBVar3 = big_block_list_attrs((BigBlock *)&bbnew.dirty,&local_60);
            ppcVar5 = &pBVar3->data;
            for (uVar8 = 0; uVar8 < local_60; uVar8 = uVar8 + 1) {
              big_block_set_attr((BigBlock *)&ptrnew.aoffset,ppcVar5[-1],*ppcVar5,
                                 (char *)((long)ppcVar5 + -0x14),((BigAttr *)(ppcVar5 + -3))->nmemb)
              ;
              ppcVar5 = ppcVar5 + 4;
            }
            iVar2 = big_block_close((BigBlock *)&ptrnew.aoffset);
            __stream = _stderr;
            if (iVar2 == 0) {
              big_block_close((BigBlock *)&bbnew.dirty);
              big_file_close((BigFile *)&buffersize);
              big_file_close(&bf);
              return 0;
            }
            pcVar4 = big_file_get_error_message();
            __format = "failed to close new: %s\n";
          }
          else {
            pcVar4 = big_file_get_error_message();
            __format = "failed to create temp: %s\n";
          }
          goto LAB_00102815;
        }
      }
    }
    __stream = _stderr;
    uStack_350 = 0x102839;
    pcVar4 = big_file_get_error_message();
    __format = "failed to open: %s\n";
  }
  else {
LAB_001027ca:
    uStack_350 = 0x1027cf;
    usage();
    __stream = _stderr;
    uStack_350 = 0x1027de;
    pcVar4 = big_file_get_error_message();
    __format = "failed to read original: %s\n";
    fsize = (size_t *)auStack_348;
  }
LAB_00102815:
  fsize[-1] = 0x102822;
  fprintf(__stream,__format,pcVar4);
  fsize[-1] = 1;
  uVar1 = fsize[-1];
  fsize[-1] = 0x10282a;
  exit((int)uVar1);
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigFile bfnew = {0};
    BigBlock bb = {0};
    BigBlock bbnew = {0};
    int verbose = 0;
    int ch;
    int Nfile = -1;
    size_t buffersize = 256 * 1024 * 1024;
    char * newfile = NULL;
    while(-1 != (ch = getopt(argc, argv, "n:vB:f:"))) {
        switch(ch) {
            case 'f':
                newfile = optarg;
                break;
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(newfile == NULL) {
        newfile = argv[1];
    }
    if(0 != big_file_create(&bfnew, newfile)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    /* avoid Nfile == 0 */
    size_t newsize[Nfile + 10];
    int i;
    for(i = 0; i < Nfile; i ++) {
        newsize[i] = (i + 1) * bb.size / Nfile
            - i * bb.size / Nfile;
    }

    if(0 != big_file_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, newsize)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }
    
    if(bb.nmemb > 0 && bb.size > 0) {
        /* copy data */
        size_t chunksize = buffersize / (bb.nmemb * dtype_itemsize(bb.dtype));
        BigBlockPtr ptrnew;
        ptrdiff_t offset;
        BigArray array;

        for(offset = 0; offset < bb.size; ) {
            if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
                fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
                exit(1);
            }
            if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
                fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
                exit(1);
            }

            if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
                fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
                exit(1);
            }

            free(array.data);
            offset += array.dims[0];
            if(verbose) {
                fprintf(stderr, "%td / %td done (%0.4g%%)\r", offset, bb.size, (100. / bb.size) * offset);
            }
        }
    }
    if(0 != big_block_close(&bbnew)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_close(&bb);
    big_file_close(&bf);
    big_file_close(&bfnew);
    return 0;
}